

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O2

void __thiscall sf::Shape::~Shape(Shape *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Shape::~Shape()
{
}